

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Velocitizer.cpp
# Opt level: O2

void __thiscall OpenMD::Velocitizer::removeAngularDrift(Velocitizer *this)

{
  Molecule *pMVar1;
  StuntDouble *this_00;
  pointer ppSVar2;
  MoleculeIterator mi;
  Vector3d omega;
  Vector3d com;
  Vector3d vdrift;
  Vector3d tempComPos;
  Vector3d angularMomentum;
  Mat3x3d inertiaTensor;
  MoleculeIterator local_1a0;
  Vector<double,_3U> local_198;
  Vector<double,_3U> local_180;
  Vector<double,_3U> local_168;
  Vector<double,_3U> local_150;
  RectMatrix<double,_3U,_3U> local_138;
  Vector<double,_3U> local_f0;
  Vector<double,_3U> local_d8;
  Vector<double,_3U> local_c0;
  Vector<double,_3U> local_a8;
  Vector<double,_3U> local_90;
  RectMatrix<double,_3U,_3U> local_78;
  
  Vector<double,_3U>::Vector(&local_150);
  Vector<double,_3U>::Vector(&local_168);
  Thermo::getComAll(&this->thermo_,(Vector3d *)&local_168,(Vector3d *)&local_150);
  SquareMatrix<double,_3>::SquareMatrix((SquareMatrix<double,_3> *)&local_78);
  Vector<double,_3U>::Vector(&local_90);
  Vector<double,_3U>::Vector(&local_180);
  Thermo::getInertiaTensor(&this->thermo_,(Mat3x3d *)&local_78,(Vector3d *)&local_90);
  SquareMatrix3<double>::inverse
            ((SquareMatrix3<double> *)&local_138,(SquareMatrix3<double> *)&local_78);
  RectMatrix<double,_3U,_3U>::operator=(&local_78,&local_138);
  operator*((Vector<double,_3U> *)&local_138,&local_78,&local_90);
  Vector3<double>::operator=((Vector3<double> *)&local_180,(Vector<double,_3U> *)&local_138);
  local_1a0._M_node = (_Base_ptr)0x0;
  Vector<double,_3U>::Vector((Vector<double,_3U> *)&local_138);
  pMVar1 = SimInfo::beginMolecule(this->info_,&local_1a0);
  while (pMVar1 != (Molecule *)0x0) {
    ppSVar2 = (pMVar1->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppSVar2 !=
        (pMVar1->integrableObjects_).
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_001df6b8;
    this_00 = (StuntDouble *)0x0;
    while (this_00 != (StuntDouble *)0x0) {
      StuntDouble::getPos((Vector3d *)&local_a8,this_00);
      operator-(&local_198,&local_a8,&local_168);
      Vector3<double>::operator=((Vector3<double> *)&local_138,&local_198);
      StuntDouble::getVel((Vector3d *)&local_d8,this_00);
      operator-(&local_c0,&local_d8,&local_150);
      cross<double>((Vector3<double> *)&local_f0,(Vector3<double> *)&local_180,
                    (Vector3<double> *)&local_138);
      operator-(&local_a8,&local_c0,&local_f0);
      Vector<double,_3U>::Vector(&local_198,&local_a8);
      StuntDouble::setVel(this_00,(Vector3d *)&local_198);
      ppSVar2 = ppSVar2 + 1;
      this_00 = (StuntDouble *)0x0;
      if (ppSVar2 !=
          (pMVar1->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_001df6b8:
        this_00 = *ppSVar2;
      }
    }
    pMVar1 = SimInfo::nextMolecule(this->info_,&local_1a0);
  }
  return;
}

Assistant:

void Velocitizer::removeAngularDrift() {
    // Get the Center of Mass drift velocity.

    Vector3d vdrift;
    Vector3d com;

    thermo_.getComAll(com, vdrift);

    Mat3x3d inertiaTensor;
    Vector3d angularMomentum;
    Vector3d omega;

    thermo_.getInertiaTensor(inertiaTensor, angularMomentum);

    // We now need the inverse of the inertia tensor.
    inertiaTensor = inertiaTensor.inverse();
    omega         = inertiaTensor * angularMomentum;

    SimInfo::MoleculeIterator mi;
    Molecule::IntegrableObjectIterator ioi;
    Molecule* mol;
    StuntDouble* sd;
    Vector3d tempComPos;

    // Corrects for the center of mass angular drift by summing all
    // the angular momentum and dividing by the total mass.

    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      for (sd = mol->beginIntegrableObject(ioi); sd != NULL;
           sd = mol->nextIntegrableObject(ioi)) {
        tempComPos = sd->getPos() - com;
        sd->setVel((sd->getVel() - vdrift) - cross(omega, tempComPos));
      }
    }
  }